

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O0

void assertEquals<int,unsigned_long>(int t1,unsigned_long t2)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  unsigned_long local_18;
  unsigned_long t2_local;
  int t1_local;
  
  if ((long)t1 != t2) {
    local_18 = t2;
    t2_local._4_4_ = t1;
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Assertion failed: ");
    poVar1 = std::operator<<(local_190,"Expected:");
    std::ostream::operator<<(poVar1,t2_local._4_4_);
    poVar1 = std::operator<<(local_190,", Got:");
    std::ostream::operator<<(poVar1,local_18);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_1d0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void assertEquals(T1 t1, T2 t2)
{
	if(!(t1 == t2))
	{
		std::stringstream ss;
		ss << "Assertion failed: ";
		ss << "Expected:" << t1;
		ss << ", Got:" << t2;
		throw std::runtime_error(ss.str());
	}
}